

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_13::NameResolver::ResolveLabelVar(NameResolver *this,Var *var)

{
  long lVar1;
  pointer pbVar2;
  size_t __n;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_type *psVar6;
  
  if (var->type_ != Name) {
    return;
  }
  pbVar2 = (this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((ulong)((long)(this->labels_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5) - 1;
  if (-1 < (int)uVar4) {
    __n = (var->field_2).name_._M_string_length;
    psVar6 = &pbVar2[uVar4]._M_string_length;
    lVar5 = 0;
    do {
      if (*psVar6 == __n) {
        if (__n == 0) {
LAB_00f4f70f:
          Var::set_index(var,-(int)lVar5);
          return;
        }
        iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar6 + -1))->_M_dataplus)._M_p,(var->field_2).name_._M_dataplus._M_p,__n);
        if (iVar3 == 0) goto LAB_00f4f70f;
      }
      lVar1 = lVar5 + (ulong)uVar4 + 1;
      lVar5 = lVar5 + -1;
      psVar6 = psVar6 + -4;
    } while (lVar1 != 1 && -1 < lVar1 + -1);
  }
  PrintError(this,&var->loc,"undefined label variable \"%s\"",(var->field_2).name_._M_dataplus._M_p)
  ;
  return;
}

Assistant:

void NameResolver::ResolveLabelVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        var->set_index(labels_.size() - i - 1);
        return;
      }
    }
    PrintError(&var->loc, "undefined label variable \"%s\"",
               var->name().c_str());
  }
}